

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O0

FileInfoMap *
efsw::Platform::FileSystem::filesInfoFromPath(FileInfoMap *__return_storage_ptr__,string *path)

{
  int iVar1;
  char *__name;
  DIR *__dirp;
  dirent *pdVar2;
  mapped_type *this;
  FileInfo local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [8];
  string fpath;
  allocator local_61;
  string local_60 [8];
  string name;
  dirent *dirp;
  DIR *dp;
  string *path_local;
  FileInfoMap *files;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::map(__return_storage_ptr__);
  __name = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(__name);
  if (__dirp != (DIR *)0x0) {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      iVar1 = strcmp(pdVar2->d_name,"..");
      if ((iVar1 != 0) && (iVar1 = strcmp(pdVar2->d_name,"."), iVar1 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,pdVar2->d_name,&local_61);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        std::operator+(local_88,path);
        FileInfo::FileInfo(&local_d0,local_88);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)local_60);
        FileInfo::operator=(this,&local_d0);
        FileInfo::~FileInfo(&local_d0);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::~string(local_60);
      }
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

FileInfoMap FileSystem::filesInfoFromPath( const std::string& path ) {
	FileInfoMap files;

	DIR* dp;
	struct dirent* dirp;

	if ( ( dp = opendir( path.c_str() ) ) == NULL )
		return files;

	while ( ( dirp = readdir( dp ) ) != NULL ) {
		if ( strcmp( dirp->d_name, ".." ) != 0 && strcmp( dirp->d_name, "." ) != 0 ) {
			std::string name( dirp->d_name );
			std::string fpath( path + name );

			files[name] = FileInfo( fpath );
		}
	}

	closedir( dp );

	return files;
}